

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

void prsgexp(prscxdef *ctx,prsndef *n)

{
  ushort *puVar1;
  ushort uVar2;
  uchar uVar3;
  int iVar4;
  prsndef *ppVar5;
  uint16_t tmp;
  short sVar6;
  uint uVar7;
  ulong uVar8;
  uint *lblp;
  emtcxdef *peVar9;
  prsndef *nsub;
  uint local_34;
  uint local_30;
  uint local_2c;
  
LAB_0011f42e:
  iVar4 = n->prsnnlf;
  if (iVar4 == 2) {
    uVar7 = n->prsntyp;
    switch(uVar7) {
    case 0x32:
      iVar4 = prsgargs(ctx,(n->prsnv).prsnvn[1]);
      ppVar5 = (n->prsnv).prsnvn[0];
      goto LAB_0011f68f;
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3c:
    case 0x3d:
    case 0x3e:
      goto switchD_0011f44d_caseD_33;
    case 0x3a:
      prsgexp(ctx,(n->prsnv).prsnvn[0]);
      prsgexp(ctx,(n->prsnv).prsnvn[1]);
      emtres(ctx->prscxemt,1);
      peVar9 = ctx->prscxemt;
      uVar2 = peVar9->emtcxofs;
      peVar9->emtcxofs = uVar2 + 1;
      peVar9->emtcxptr[uVar2] = '@';
      return;
    case 0x3b:
      sVar6 = 0;
      for (; n != (prsndef *)0x0; n = (n->prsnv).prsnvn[1]) {
        prsgexp(ctx,(n->prsnv).prsnvn[0]);
        sVar6 = sVar6 + 1;
      }
      emtres(ctx->prscxemt,1);
      peVar9 = ctx->prscxemt;
      uVar2 = peVar9->emtcxofs;
      peVar9->emtcxofs = uVar2 + 1;
      peVar9->emtcxptr[uVar2] = 'J';
      emtres(ctx->prscxemt,2);
      *(short *)(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs) = sVar6;
      puVar1 = &ctx->prscxemt->emtcxofs;
      *puVar1 = *puVar1 + 2;
      return;
    case 0x3f:
      goto switchD_0011f44d_caseD_3f;
    case 0x40:
      iVar4 = 0;
      goto LAB_0011f792;
    case 0x41:
    case 0x42:
      local_2c = emtglbl(ctx->prscxemt);
      lblp = &local_2c;
      prsgexp(ctx,(n->prsnv).prsnvn[0]);
      emtjmp(ctx->prscxemt,n->prsntyp == 0x42 | 0x44,local_2c);
      prsgexp(ctx,(n->prsnv).prsnvn[1]);
      peVar9 = ctx->prscxemt;
      goto LAB_0011f61a;
    default:
      if (uVar7 < 0x20) {
        if ((0x7ffbcU >> (uVar7 & 0x1f) & 1) != 0) {
          prsgexp(ctx,(n->prsnv).prsnvn[0]);
          prsgexp(ctx,(n->prsnv).prsnvn[1]);
          emtres(ctx->prscxemt,1);
          uVar3 = (&prsb_cma.field_0x26)[n->prsntyp];
          peVar9 = ctx->prscxemt;
          uVar2 = peVar9->emtcxofs;
          peVar9->emtcxofs = uVar2 + 1;
          peVar9->emtcxptr[uVar2] = uVar3;
          return;
        }
        if (uVar7 == 0x1f) {
          prsgdotspec(ctx,n);
          return;
        }
      }
      if (uVar7 - 0x9a < 0xb) {
        prsgexp(ctx,(n->prsnv).prsnvn[1]);
        uVar7 = n->prsntyp;
        ppVar5 = (n->prsnv).prsnvn[0];
        goto LAB_0011f669;
      }
switchD_0011f44d_caseD_33:
      errsigf(ctx->prscxerr,"TADS",0x138);
    }
  }
  if (iVar4 == 3) {
    if (n->prsntyp == 0x40) {
      iVar4 = prsgargs(ctx,(n->prsnv).prsnvn[2]);
LAB_0011f792:
      prsgdot(ctx,n,iVar4);
      return;
    }
    if (n->prsntyp != 0x56) {
      return;
    }
    prsgexp(ctx,(n->prsnv).prsnvn[0]);
    local_30 = emtglbl(ctx->prscxemt);
    emtjmp(ctx->prscxemt,'\x1b',local_30);
    prsgexp(ctx,(n->prsnv).prsnvn[1]);
    local_34 = emtglbl(ctx->prscxemt);
    lblp = &local_34;
    emtjmp(ctx->prscxemt,'\x1a',local_34);
    emtslbl(ctx->prscxemt,&local_30,1);
    prsgexp(ctx,(n->prsnv).prsnvn[2]);
    peVar9 = ctx->prscxemt;
LAB_0011f61a:
    emtslbl(peVar9,lblp,1);
    return;
  }
  if (iVar4 != 1) {
    if (iVar4 != 0) {
      return;
    }
    prsdef(ctx,&(n->prsnv).prsnvt,7);
    emtval(ctx->prscxemt,&(n->prsnv).prsnvt,ctx->prscxpool);
    return;
  }
  uVar7 = n->prsntyp;
  uVar8 = (ulong)uVar7;
  if (uVar8 < 0x33) {
    if ((0x4000004cUL >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0011f7af;
    if (uVar8 == 0x32) {
      ppVar5 = (n->prsnv).prsnvn[0];
      iVar4 = 0;
LAB_0011f68f:
      prsgfn(ctx,ppVar5,iVar4);
      return;
    }
  }
  if (uVar7 - 0x96 < 4) {
    ppVar5 = (n->prsnv).prsnvn[0];
LAB_0011f669:
    prsglval(ctx,uVar7,ppVar5);
    return;
  }
  if (1 < uVar7 - 0x5e) {
    errsigf(ctx->prscxerr,"TADS",0x136);
  }
LAB_0011f7af:
  prsgexp(ctx,(n->prsnv).prsnvn[0]);
  if (n->prsntyp != 2) {
    emtres(ctx->prscxemt,1);
    iVar4 = n->prsntyp;
    if (iVar4 == 3) {
      uVar3 = '\x03';
    }
    else if (iVar4 == 0x1e) {
      uVar3 = 'W';
    }
    else if (iVar4 == 0x5e) {
      uVar3 = 'Z';
    }
    else {
      uVar3 = '\x04';
      if (iVar4 == 0x5f) {
        uVar3 = '[';
      }
    }
    peVar9 = ctx->prscxemt;
    uVar2 = peVar9->emtcxofs;
    peVar9->emtcxofs = uVar2 + 1;
    peVar9->emtcxptr[uVar2] = uVar3;
  }
  return;
switchD_0011f44d_caseD_3f:
  prsgexp(ctx,(n->prsnv).prsnvn[0]);
  n = (n->prsnv).prsnvn[1];
  goto LAB_0011f42e;
}

Assistant:

void prsgexp(prscxdef *ctx, prsndef *n)
{
    int cnt;
    
    switch(n->prsnnlf)
    {
    case 0:
        prsdef(ctx, &n->prsnv.prsnvt, TOKSTFWDOBJ);
        emtval(ctx->prscxemt, &n->prsnv.prsnvt, ctx->prscxpool);
        break;
        
    case 1:
        switch(n->prsntyp)
        {
        case TOKTINC:
        case TOKTDEC:
        case TOKTPOSTINC:
        case TOKTPOSTDEC:
            prsglval(ctx, n->prsntyp, n->prsnv.prsnvn[0]);
            break;
            
        case TOKTPLUS:
        case TOKTMINUS:
        case TOKTNOT:
        case TOKTTILDE:
        case TOKTNEW:
        case TOKTDELETE:
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            if (n->prsntyp != TOKTPLUS)
                emtop(ctx->prscxemt,
                      n->prsntyp == TOKTMINUS ? OPCNEG :
                      n->prsntyp == TOKTTILDE ? OPCBNOT :
                      n->prsntyp == TOKTNEW ? OPCNEW :
                      n->prsntyp == TOKTDELETE ? OPCDELETE :
                      OPCNOT);
            break;

        case TOKTLPAR:
            prsgfn(ctx, n->prsnv.prsnvn[0], 0);
            break;

        default:
            errsig(ctx->prscxerr, ERR_REQUNO);
        }
        break;
        
    case 2:
        switch(n->prsntyp)
        {
        case TOKTAND:
        case TOKTOR:
        {
            uint lab;
            
            lab = emtglbl(ctx->prscxemt);
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            emtjmp(ctx->prscxemt,
                   (uchar)(n->prsntyp == TOKTAND ? OPCJSF : OPCJST),
                   lab);
            prsgexp(ctx, n->prsnv.prsnvn[1]);
            emtslbl(ctx->prscxemt, &lab, TRUE);
            break;
        }
        
        case TOKTPLUS:
        case TOKTMINUS:
        case TOKTDIV:
        case TOKTMOD:
        case TOKTTIMES:
        case TOKTEQ:
        case TOKTNE:
        case TOKTGT:
        case TOKTGE:
        case TOKTLT:
        case TOKTLE:
        case TOKTBAND:
        case TOKTBOR:
        case TOKTXOR:
        case TOKTSHL:
        case TOKTSHR:
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            prsgexp(ctx, n->prsnv.prsnvn[1]);
            emtop(ctx->prscxemt, prsbopl[n->prsntyp - TOKTPLUS]);
            break;
            
        case TOKTCOMMA:
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            prsgexp(ctx, n->prsnv.prsnvn[1]);
            break;
            
        case TOKTLPAR:                      /* function call with arguments */
            cnt = prsgargs(ctx, n->prsnv.prsnvn[1]);      /* push arguments */
            prsgfn(ctx, n->prsnv.prsnvn[0], cnt);
            break;
        
        case TOKTASSIGN:
        case TOKTPLEQ:
        case TOKTMINEQ:
        case TOKTDIVEQ:
        case TOKTMODEQ:
        case TOKTTIMEQ:
        case TOKTBANDEQ:
        case TOKTBOREQ:
        case TOKTXOREQ:
        case TOKTSHLEQ:
        case TOKTSHREQ:
            prsgexp(ctx, n->prsnv.prsnvn[1]);      /* eval right side of := */
            prsglval(ctx, n->prsntyp, n->prsnv.prsnvn[0]);
            break;
            
        case TOKTDOT:
            prsgdot(ctx, n, 0);
            break;

        case TOKTDOTSPEC:
            prsgdotspec(ctx, n);
            break;
            
        case TOKTLBRACK:
            prsgexp(ctx, n->prsnv.prsnvn[0]);    /* push list being indexed */
            prsgexp(ctx, n->prsnv.prsnvn[1]);       /* push the index value */
            emtop(ctx->prscxemt, OPCINDEX);
            break;
        
        case TOKTRBRACK:
        {
            prsndef *nsub;
            uint     cnt;
            
            for (cnt = 0, nsub = n ; nsub
                 ; ++cnt, nsub = nsub->prsnv.prsnvn[1])
                prsgexp(ctx, nsub->prsnv.prsnvn[0]);
            emtop(ctx->prscxemt, OPCCONS);         /* construction operator */
            emtint2(ctx->prscxemt, cnt);
            break;
        }
            
        default:
            errsig(ctx->prscxerr, ERR_INVBIN);
        }
        break;

    case 3:
        switch(n->prsntyp)
        {
        case TOKTQUESTION:
        {
            uint lfalse;                          /* label for FALSE branch */
            uint ldone;                       /* label for end of condition */
            
            prsgexp(ctx, n->prsnv.prsnvn[0]);         /* evaluate condition */
            lfalse = emtglbl(ctx->prscxemt);
            emtjmp(ctx->prscxemt, OPCJF, lfalse);
            prsgexp(ctx, n->prsnv.prsnvn[1]);             /* eval TRUE expr */
            ldone = emtglbl(ctx->prscxemt);
            emtjmp(ctx->prscxemt, OPCJMP, ldone);
            emtslbl(ctx->prscxemt, &lfalse, TRUE);
            prsgexp(ctx, n->prsnv.prsnvn[2]);          /* eval FALSE branch */
            emtslbl(ctx->prscxemt, &ldone, TRUE);
            break;
        }
        case TOKTDOT:
            cnt = prsgargs(ctx, n->prsnv.prsnvn[2]);
            prsgdot(ctx, n, cnt);
            break;
        }
        break;
    }
}